

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void __thiscall Map::Effect(Map *this,MapEffect effect,uchar param)

{
  bool bVar1;
  reference ppCVar2;
  Character *character;
  iterator __end1;
  iterator __begin1;
  list<Character_*,_std::allocator<Character_*>_> *__range1;
  undefined1 local_48 [8];
  PacketBuilder builder;
  uchar param_local;
  MapEffect effect_local;
  Map *this_local;
  
  builder.add_size._6_1_ = param;
  builder.add_size._7_1_ = effect;
  PacketBuilder::PacketBuilder((PacketBuilder *)local_48,PACKET_EFFECT,PACKET_USE,2);
  PacketBuilder::AddChar((PacketBuilder *)local_48,(uint)builder.add_size._7_1_);
  PacketBuilder::AddChar((PacketBuilder *)local_48,(uint)builder.add_size._6_1_);
  __end1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(&this->characters);
  character = (Character *)
              std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(&this->characters);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&character);
    if (!bVar1) break;
    ppCVar2 = std::_List_iterator<Character_*>::operator*(&__end1);
    Character::Send(*ppCVar2,(PacketBuilder *)local_48);
    std::_List_iterator<Character_*>::operator++(&__end1);
  }
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_48);
  return;
}

Assistant:

void Map::Effect(MapEffect effect, unsigned char param)
{
	PacketBuilder builder(PACKET_EFFECT, PACKET_USE, 2);
	builder.AddChar(effect);
	builder.AddChar(param);

	UTIL_FOREACH(this->characters, character)
	{
		character->Send(builder);
	}
}